

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXcFramework.cxx
# Opt level: O3

cmXcFrameworkPlistLibrary * __thiscall
cmXcFrameworkPlist::SelectSuitableLibrary
          (cmXcFrameworkPlist *this,cmMakefile *mf,cmListFileBacktrace *bt)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pointer pcVar3;
  cmXcFrameworkPlistLibrary *pcVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  cmake *this_00;
  cmXcFrameworkPlistLibrary *pcVar8;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string systemName;
  string supportedSystemName;
  cmXcFrameworkPlistLibrary *local_140;
  long *local_138;
  char *local_130;
  long local_128 [2];
  cmXcFrameworkPlist *local_118;
  cmListFileBacktrace *local_110;
  cmMakefile *local_108;
  string local_100;
  string local_e0;
  pointer local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined8 local_a0;
  char *local_98;
  long *local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  paVar1 = &local_e0.field_2;
  local_e0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"CMAKE_SYSTEM_NAME","");
  psVar7 = cmMakefile::GetSafeDefinition(mf,&local_e0);
  local_138 = local_128;
  pcVar3 = (psVar7->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,pcVar3,pcVar3 + psVar7->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  local_110 = bt;
  local_108 = mf;
  bVar5 = cmMakefile::PlatformIsAppleSimulator(mf);
  pcVar8 = (this->AvailableLibraries).
           super__Vector_base<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar4 = (this->AvailableLibraries).
           super__Vector_base<cmXcFrameworkPlistLibrary,_std::allocator<cmXcFrameworkPlistLibrary>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118 = this;
  if (pcVar8 != pcVar4) {
    do {
      local_e0._M_string_length = 0;
      local_e0.field_2._M_allocated_capacity =
           local_e0.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_e0._M_dataplus._M_p = (pointer)paVar1;
      if ((ulong)pcVar8->SupportedPlatform < 5) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_e0,0,(char *)0x0,
                   (ulong)(&DAT_0089ec74 +
                          *(int *)(&DAT_0089ec74 + (ulong)pcVar8->SupportedPlatform * 4)));
      }
      if ((local_130 == (char *)local_e0._M_string_length) &&
         ((local_130 == (char *)0x0 ||
          (iVar6 = bcmp(local_138,local_e0._M_dataplus._M_p,(size_t)local_130), iVar6 == 0)))) {
        bVar2 = (pcVar8->SupportedPlatformVariant).
                super__Optional_base<cmXcFrameworkPlistSupportedPlatformVariant,_true,_true>.
                _M_payload.super__Optional_payload_base<cmXcFrameworkPlistSupportedPlatformVariant>.
                _M_engaged;
        if (bVar2 == bVar5 && bVar5) {
          if ((pcVar8->SupportedPlatformVariant).
              super__Optional_base<cmXcFrameworkPlistSupportedPlatformVariant,_true,_true>.
              _M_payload.super__Optional_payload_base<cmXcFrameworkPlistSupportedPlatformVariant>.
              _M_payload._M_value != simulator) goto LAB_0035fa45;
        }
        else if (bVar2 != bVar5) goto LAB_0035fa45;
        bVar2 = false;
        local_140 = pcVar8;
      }
      else {
LAB_0035fa45:
        bVar2 = true;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != paVar1) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) goto LAB_0035fb59;
      pcVar8 = pcVar8 + 1;
    } while (pcVar8 != pcVar4);
  }
  this_00 = cmMakefile::GetCMakeInstance(local_108);
  local_e0._M_dataplus._M_p = (pointer)0x26;
  local_e0._M_string_length = 0x89eb31;
  local_e0.field_2._M_allocated_capacity = 0;
  local_c0 = (local_118->Path)._M_dataplus._M_p;
  local_e0.field_2._8_8_ = (local_118->Path)._M_string_length;
  local_b8 = 0;
  local_b0 = 0x12;
  local_a8 = "\nfor system name \"";
  local_a0 = 0;
  local_98 = local_130;
  local_90 = local_138;
  local_88 = 0;
  local_78 = local_50;
  local_68 = 0;
  local_60 = 1;
  local_50[0] = 0x22;
  local_80 = 1;
  local_70 = 0;
  views._M_len = 5;
  views._M_array = (iterator)&local_e0;
  local_58 = local_78;
  cmCatViews(&local_100,views);
  cmake::IssueMessage(this_00,FATAL_ERROR,&local_100,local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  local_140 = (cmXcFrameworkPlistLibrary *)0x0;
LAB_0035fb59:
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  return local_140;
}

Assistant:

const cmXcFrameworkPlistLibrary* cmXcFrameworkPlist::SelectSuitableLibrary(
  const cmMakefile& mf, const cmListFileBacktrace& bt) const
{
  auto systemName = mf.GetSafeDefinition("CMAKE_SYSTEM_NAME");
  cm::optional<cmXcFrameworkPlistSupportedPlatformVariant> systemVariant;
  if (mf.PlatformIsAppleSimulator()) {
    systemVariant = cmXcFrameworkPlistSupportedPlatformVariant::simulator;
  }

  for (auto const& lib : this->AvailableLibraries) {
    std::string supportedSystemName;
    switch (lib.SupportedPlatform) {
      case cmXcFrameworkPlistSupportedPlatform::macOS:
        supportedSystemName = "Darwin";
        break;
      case cmXcFrameworkPlistSupportedPlatform::iOS:
        supportedSystemName = "iOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::tvOS:
        supportedSystemName = "tvOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::watchOS:
        supportedSystemName = "watchOS";
        break;
      case cmXcFrameworkPlistSupportedPlatform::visionOS:
        supportedSystemName = "visionOS";
        break;
    }

    if (systemName == supportedSystemName &&
        systemVariant == lib.SupportedPlatformVariant) {
      return &lib;
    }
  }

  mf.GetCMakeInstance()->IssueMessage(
    MessageType::FATAL_ERROR,
    cmStrCat("Unable to find suitable library in:\n  ", this->Path,
             "\nfor system name \"", systemName, '"'),
    bt);
  return nullptr;
}